

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_markov_node.cpp
# Opt level: O2

void __thiscall gauss_markov_node::update(gauss_markov_node *this,double time)

{
  vec3 *pvVar1;
  int iVar2;
  vec3 *pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = (this->super_node).x;
  if (dVar4 <= XMIN) {
    iVar2 = 1;
    dVar5 = XMIN;
LAB_00103a26:
    (this->super_node).x = (dVar5 + dVar5) - dVar4;
    reflect(this,iVar2);
  }
  else if (XMAX <= dVar4) {
    iVar2 = 2;
    dVar5 = XMAX;
    goto LAB_00103a26;
  }
  dVar4 = (this->super_node).y;
  if (dVar4 <= YMIN) {
    iVar2 = 3;
    dVar5 = YMIN;
LAB_00103a68:
    (this->super_node).y = (dVar5 + dVar5) - dVar4;
    reflect(this,iVar2);
  }
  else if (YMAX <= dVar4) {
    iVar2 = 4;
    dVar5 = YMAX;
    goto LAB_00103a68;
  }
  dVar4 = (this->super_node).z;
  if (dVar4 <= ZMIN) {
    iVar2 = 5;
    dVar5 = ZMIN;
  }
  else {
    if (dVar4 < ZMAX) goto LAB_00103ac1;
    iVar2 = 6;
    dVar5 = ZMAX;
  }
  (this->super_node).z = (dVar5 + dVar5) - dVar4;
  reflect(this,iVar2);
LAB_00103ac1:
  dVar4 = node::getv(&this->super_node);
  dVar5 = node::getd(&this->super_node);
  dVar5 = cos(dVar5);
  dVar6 = node::getp(&this->super_node);
  dVar6 = sin(dVar6);
  (this->super_node).x = dVar6 * dVar5 * dVar4 * time + (this->super_node).x;
  dVar4 = node::getv(&this->super_node);
  dVar5 = node::getd(&this->super_node);
  dVar5 = sin(dVar5);
  dVar6 = node::getp(&this->super_node);
  dVar6 = sin(dVar6);
  (this->super_node).y = dVar6 * dVar5 * dVar4 * time + (this->super_node).y;
  dVar4 = node::getv(&this->super_node);
  dVar5 = node::getp(&this->super_node);
  dVar5 = cos(dVar5);
  dVar5 = dVar5 * dVar4 * time + (this->super_node).z;
  (this->super_node).z = dVar5;
  pvVar3 = points;
  iVar2 = (this->super_node).id;
  dVar4 = (this->super_node).y;
  pvVar1 = points + iVar2;
  pvVar1->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(float)(this->super_node).x;
  pvVar1->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(float)dVar4;
  pvVar3[iVar2].field_2.z = (float)dVar5;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  return;
}

Assistant:

void gauss_markov_node::update(double time){   //parameter time is in second
    if (this->x <= XMIN) {      //If gauss_markov_node hit the XMIN bound then reflect
        this->x = 2*XMIN - this->x;     //Fix out of bound bug: if OutOfBound then mirror
        reflect(1);
    }else if(this->x >= XMAX){  //If gauss_markov_node hit the XMAX bound then reflect
        this->x = 2*XMAX - this->x;
        reflect(2);
    }
    if (this->y <= YMIN) {
        this->y = 2*YMIN - this->y;
        reflect(3);
    } else if(this->y >= YMAX){
        this->y = 2*YMAX - this->y;
        reflect(4);
    }
    if (this->z <=ZMIN){
        this->z = 2*ZMIN - this->z;
        reflect(5);
    }else if(this->z >= ZMAX){
        this->z = 2*ZMAX - this->z;
        reflect(6);
    }
//    if(this->x >= (XMAX-xbuffer)){
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.25*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.75*M_PI);
//        else this->setdmean(M_PI);
//    }else if(this->x <= (XMIN+xbuffer)){
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.75*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.25*M_PI);
//        else this->setdmean(0);
//    }else {
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.5*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.5*M_PI);
//    }
    this->x += this->getv()*cos(this->getd())*sin(this->getp())*time;
    this->y += this->getv()*sin(this->getd())*sin(this->getp())*time;
    this->z += this->getv()*cos(this->getp())*time;
//    printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
//    series->dataProxy()->resetArray(points);
}